

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_inter_pred_filters.c
# Opt level: O1

void ihevc_inter_pred_luma_horz
               (UWORD8 *pu1_src,UWORD8 *pu1_dst,WORD32 src_strd,WORD32 dst_strd,WORD8 *pi1_coeff,
               WORD32 ht,WORD32 wd)

{
  UWORD8 UVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  short sVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  
  if (0 < ht) {
    iVar8 = 0;
    do {
      if (0 < wd) {
        lVar4 = -0x300000000;
        uVar6 = 0;
        do {
          lVar7 = 0;
          sVar5 = 0;
          lVar3 = lVar4;
          do {
            sVar5 = sVar5 + (ushort)pu1_src[lVar3 >> 0x20] * (short)pi1_coeff[lVar7];
            lVar7 = lVar7 + 1;
            lVar3 = lVar3 + 0x100000000;
          } while (lVar7 != 8);
          iVar2 = sVar5 * 0x400 + 0x8000 >> 0x10;
          if (iVar2 < 1) {
            iVar2 = 0;
          }
          UVar1 = (UWORD8)iVar2;
          if (0xfe < iVar2) {
            UVar1 = 0xff;
          }
          pu1_dst[uVar6] = UVar1;
          uVar6 = uVar6 + 1;
          lVar4 = lVar4 + 0x100000000;
        } while (uVar6 != (uint)wd);
      }
      pu1_src = pu1_src + src_strd;
      pu1_dst = pu1_dst + dst_strd;
      iVar8 = iVar8 + 1;
    } while (iVar8 != ht);
  }
  return;
}

Assistant:

void ihevc_inter_pred_luma_horz(UWORD8 *pu1_src,
                                UWORD8 *pu1_dst,
                                WORD32 src_strd,
                                WORD32 dst_strd,
                                WORD8 *pi1_coeff,
                                WORD32 ht,
                                WORD32 wd)
{
    WORD32 row, col, i;
    WORD16 i2_tmp;

    for(row = 0; row < ht; row++)
    {
        for(col = 0; col < wd; col++)
        {
            i2_tmp = 0;
            for(i = 0; i < NTAPS_LUMA; i++)
                i2_tmp += pi1_coeff[i] * pu1_src[col + (i - 3)];

            i2_tmp = (i2_tmp + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH;
            i2_tmp = CLIP_U8(i2_tmp);

            pu1_dst[col] = (UWORD8)i2_tmp;
        }

        pu1_src += src_strd;
        pu1_dst += dst_strd;
    }

}